

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matte.cpp
# Opt level: O0

MatteMaterial * phyr::createMatteMaterial(double Kd,double sigma)

{
  MatteMaterial *Kd_00;
  shared_ptr<phyr::Texture<double>_> _sigma;
  shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> kd;
  shared_ptr<phyr::ConstantTexture<double>_> *in_stack_fffffffffffffd98;
  SampledSpectrum *in_stack_fffffffffffffda0;
  shared_ptr<phyr::Texture<double>_> *this;
  MatteMaterial *this_00;
  SampledSpectrum *in_stack_fffffffffffffdc8;
  shared_ptr<phyr::Texture<double>_> local_230 [2];
  MatteMaterial local_210 [13];
  
  this_00 = local_210;
  SampledSpectrum::SampledSpectrum(in_stack_fffffffffffffda0,(double)in_stack_fffffffffffffd98);
  std::make_shared<phyr::ConstantTexture<phyr::SampledSpectrum>,phyr::SampledSpectrum>
            (in_stack_fffffffffffffdc8);
  std::shared_ptr<phyr::Texture<phyr::SampledSpectrum>>::
  shared_ptr<phyr::ConstantTexture<phyr::SampledSpectrum>,void>
            ((shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *)in_stack_fffffffffffffda0,
             (shared_ptr<phyr::ConstantTexture<phyr::SampledSpectrum>_> *)in_stack_fffffffffffffd98)
  ;
  std::shared_ptr<phyr::ConstantTexture<phyr::SampledSpectrum>_>::~shared_ptr
            ((shared_ptr<phyr::ConstantTexture<phyr::SampledSpectrum>_> *)0x193a74);
  std::make_shared<phyr::ConstantTexture<double>,double&>((double *)in_stack_fffffffffffffdc8);
  this = local_230;
  std::shared_ptr<phyr::Texture<double>>::shared_ptr<phyr::ConstantTexture<double>,void>
            (this,in_stack_fffffffffffffd98);
  std::shared_ptr<phyr::ConstantTexture<double>_>::~shared_ptr
            ((shared_ptr<phyr::ConstantTexture<double>_> *)0x193aa6);
  Kd_00 = (MatteMaterial *)operator_new(0x28);
  MatteMaterial::MatteMaterial
            (this_00,(shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *)Kd_00,this);
  std::shared_ptr<phyr::Texture<double>_>::~shared_ptr
            ((shared_ptr<phyr::Texture<double>_> *)0x193ada);
  std::shared_ptr<phyr::Texture<phyr::SampledSpectrum>_>::~shared_ptr
            ((shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *)0x193ae7);
  return Kd_00;
}

Assistant:

MatteMaterial* createMatteMaterial(Real Kd, Real sigma) {
    std::shared_ptr<Texture<Spectrum>> kd =
            std::make_shared<ConstantTexture<Spectrum>>(Spectrum(Kd));
    std::shared_ptr<Texture<Real>> _sigma =
            std::make_shared<ConstantTexture<Real>>(sigma);

    return new MatteMaterial(kd, _sigma);
}